

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::String::String(String *this,String *b)

{
  int iVar1;
  uchar *__dest;
  size_t __n;
  
  iVar1 = (b->super_tagbstring).slen;
  __n = (size_t)iVar1;
  (this->super_tagbstring).slen = iVar1;
  (this->super_tagbstring).mlen = iVar1 + 1U;
  (this->super_tagbstring).data = (uchar *)0x0;
  if (-1 < (long)__n) {
    __dest = (uchar *)malloc((ulong)(iVar1 + 1U));
    (this->super_tagbstring).data = __dest;
    if (__dest != (uchar *)0x0) {
      memcpy(__dest,(b->super_tagbstring).data,__n);
      __dest[__n] = '\0';
      return;
    }
  }
  Bstrlib::String();
  return;
}

Assistant:

String::String(const String& b)
    {
        slen = b.slen;
        mlen = slen + 1;
        data = 0;
        if (mlen > 0)
            data = (uint8 * ) malloc(mlen);
        if (!data)
        {
            bstringThrow("Failure in (String) constructor");
        }
        else
        {
            memcpy(data, b.data, slen);
            data[slen] = '\0';
        }
    }